

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O1

sunrealtype MaxError(N_Vector y,sunrealtype t)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  sunrealtype sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = 0.0;
  if ((t != 0.0) || (NAN(t))) {
    lVar1 = N_VGetArrayPointer();
    dVar6 = 0.0;
    if (t <= 30.0) {
      dVar6 = exp(t * -2.0);
    }
    dVar4 = 0.0;
    dVar7 = 1.0;
    lVar2 = 0;
    do {
      dVar8 = 1.0;
      lVar3 = 0;
      sVar5 = dVar4;
      do {
        dVar4 = pow(t,(double)(lVar2 + lVar3));
        dVar4 = ABS(*(double *)(lVar1 + lVar3 * 8) - dVar4 * dVar6 * dVar8 * dVar7);
        if (dVar4 <= sVar5) {
          dVar4 = sVar5;
        }
        lVar3 = lVar3 + 1;
        dVar8 = dVar8 / (double)lVar3;
        sVar5 = dVar4;
      } while (lVar3 != 5);
      lVar2 = lVar2 + 1;
      dVar7 = dVar7 / (double)lVar2;
      lVar1 = lVar1 + 0x28;
    } while (lVar2 != 5);
  }
  return dVar4;
}

Assistant:

static sunrealtype MaxError(N_Vector y, sunrealtype t)
{
  sunindextype i, j, k;
  sunrealtype *ydata, er, ex = ZERO, yt, maxError = ZERO, ifact_inv,
                          jfact_inv = ONE;

  if (t == ZERO) { return (ZERO); }

  ydata = N_VGetArrayPointer(y);
  if (t <= THIRTY) { ex = exp(-TWO * t); }

  for (j = 0; j < P2_MESHY; j++)
  {
    ifact_inv = ONE;
    for (i = 0; i < P2_MESHX; i++)
    {
      k  = i + j * P2_MESHX;
      yt = pow(t, i + j) * ex * ifact_inv * jfact_inv;
      er = fabs(ydata[k] - yt);
      if (er > maxError) { maxError = er; }
      ifact_inv /= (i + 1);
    }
    jfact_inv /= (j + 1);
  }
  return (maxError);
}